

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::update(ClingoView *this,Statistics *stats)

{
  Accu *pAVar1;
  StatsMap *in_RSI;
  NonHcfStats *in_RDI;
  StatsMap *in_stack_ffffffffffffff78;
  StatisticObject *in_stack_ffffffffffffff90;
  StatsMap *in_stack_ffffffffffffff98;
  StepStats *in_stack_ffffffffffffffa0;
  StatsMap *accu;
  StatsMap *solving;
  Statistics *this_00;
  StepStats *in_stack_ffffffffffffffb8;
  Accu *in_stack_ffffffffffffffc0;
  PrgDepGraph *in_stack_ffffffffffffffc8;
  bool local_21;
  
  local_21 = false;
  if (in_RSI[8].keys_.ebo_.size != 0) {
    pAVar1 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
             get((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                  *)0x122e73);
    local_21 = false;
    if (pAVar1 != (Accu *)0x0) {
      in_stack_ffffffffffffffc8 = in_RDI[1].graph_;
      SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
      operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                  *)0x122e99);
      StatsMap::toStats(in_stack_ffffffffffffff78);
      local_21 = StatsMap::add((StatsMap *)in_stack_ffffffffffffffa0,
                               (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  if (local_21 != false) {
    pAVar1 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
             operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                         *)0x122ed8);
    in_stack_ffffffffffffffb8 = &pAVar1->step;
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::operator*
              ((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                *)0x122eef);
    StepStats::addTo(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffc0 =
         SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
         operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                     *)0x122f0a);
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
    operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                *)0x122f1d);
    StatsMap::toStats(in_stack_ffffffffffffff78);
    StatsMap::add((StatsMap *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff90);
  }
  this_00 = (Statistics *)&in_RDI[2].data_;
  solving = in_RSI;
  if ((in_RSI[8].keys_.ebo_.size == 0) ||
     (pAVar1 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
               ::get((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                      *)0x122f78), pAVar1 == (Accu *)0x0)) {
    accu = (StatsMap *)0x0;
  }
  else {
    pAVar1 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
             operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                         *)0x122f8c);
    accu = &pAVar1->solving_;
  }
  addTo(this_00,solving,accu);
  if (in_RSI[8].keys_.ebo_.buf != (pointer)0x0) {
    if ((in_RSI[8].keys_.ebo_.size != 0) &&
       (pAVar1 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                 ::get((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                        *)0x12300e), pAVar1 != (Accu *)0x0)) {
      SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
      operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                  *)0x123022);
    }
    Asp::PrgDepGraph::NonHcfStats::addTo
              (in_RDI,(StatsMap *)in_stack_ffffffffffffffc8,
               &in_stack_ffffffffffffffc0->super_StatsMap,(StatsMap *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::ClingoView::update(const ClaspFacade::Statistics& stats) {
	if (stats.level_ > 0 && accu_.get() && keys_->add("accu", accu_->toStats())) {
		accu_->step.addTo(*accu_);
		accu_->add("solving", accu_->solving_.toStats());
	}
	stats.addTo(solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	if (stats.tester_) {
		stats.tester_->addTo(problem_, solving_, stats.level_ > 0 && accu_.get() ? &accu_->solving_ : 0);
	}
}